

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O3

value attribute_metadata(attribute_conflict attr)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  value *ppvVar3;
  value pvVar4;
  size_t length;
  
  v = value_create_map((value *)0x0,3);
  if (v == (value)0x0) {
    return (value)0x0;
  }
  ppvVar1 = value_to_map(v);
  pvVar2 = value_create_array((value *)0x0,2);
  if (pvVar2 != (value)0x0) {
    ppvVar3 = value_to_array(pvVar2);
    pvVar4 = value_create_string("name",4);
    *ppvVar3 = pvVar4;
    if (pvVar4 != (value)0x0) {
      __s = attr->name;
      length = strlen(__s);
      pvVar4 = value_create_string(__s,length);
      ppvVar3[1] = pvVar4;
      if (pvVar4 != (value)0x0) {
        *ppvVar1 = pvVar2;
        pvVar2 = type_metadata(attr->t);
        ppvVar1[1] = pvVar2;
        if (pvVar2 != (value)0x0) {
          pvVar2 = value_create_array((value *)0x0,2);
          if (pvVar2 != (value)0x0) {
            ppvVar3 = value_to_array(pvVar2);
            pvVar4 = value_create_string("visibility",10);
            *ppvVar3 = pvVar4;
            if (pvVar4 != (value)0x0) {
              pvVar4 = class_visibility_value(attr->visibility);
              ppvVar3[1] = pvVar4;
              if (pvVar4 != (value)0x0) {
                ppvVar1[2] = pvVar2;
                return v;
              }
            }
            value_type_destroy(pvVar2);
          }
          ppvVar1[2] = (value)0x0;
        }
        goto LAB_00106ab6;
      }
    }
    value_type_destroy(pvVar2);
  }
  *ppvVar1 = (value)0x0;
LAB_00106ab6:
  value_type_destroy(v);
  return (value)0x0;
}

Assistant:

value attribute_metadata(attribute attr)
{
	/* The structure of the attribute is:
	* {
	*	"name": "attr1",
	*	"type": { "name": "", "id": 18 },
	*	"visibility": "public"
	* }
	*/
	value *v_map, v = value_create_map(NULL, 3);

	if (v == NULL)
	{
		return NULL;
	}

	v_map = value_to_map(v);

	v_map[0] = attribute_metadata_name(attr);

	if (v_map[0] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_map[1] = type_metadata(attr->t);

	if (v_map[1] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	v_map[2] = attribute_metadata_visibility(attr);

	if (v_map[2] == NULL)
	{
		value_type_destroy(v);
		return NULL;
	}

	return v;
}